

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# extraBddThresh.c
# Opt level: O2

int Extra_ThreshSelectWeights4(word *t,int nVars,int *pW)

{
  ulong uVar1;
  int iVar2;
  uint uVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  ulong uVar7;
  int iVar8;
  int iVar9;
  
  if (nVars != 4) {
    __assert_fail("nVars == 4",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                  ,0xbe,"int Extra_ThreshSelectWeights4(word *, int, int *)");
  }
  uVar3 = 1;
  do {
    pW[3] = uVar3;
    uVar4 = uVar3;
    if (uVar3 == 5) {
      return 0;
    }
    for (; pW[2] = uVar4, uVar5 = uVar4, uVar4 != 5; uVar4 = uVar4 + 1) {
      for (; pW[1] = uVar5, uVar6 = uVar5, uVar5 < 5; uVar5 = uVar5 + 1) {
        for (; *pW = uVar6, uVar6 < 5; uVar6 = uVar6 + 1) {
          uVar7 = 0;
          iVar9 = 10000;
          iVar8 = 0;
          do {
            if ((int)uVar7 == 0x10) {
              if (iVar8 < iVar9) {
                return iVar9;
              }
              __assert_fail("Lmax < Lmin",
                            "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/bdd/extrab/extraBddThresh.c"
                            ,0xd1,"int Extra_ThreshSelectWeights4(word *, int, int *)");
            }
            uVar1 = t[uVar7 >> 6 & 0x3ffffff];
            iVar2 = Extra_ThreshWeightedSum(pW,4,(int)uVar7);
            if ((uVar1 >> (uVar7 & 0x3f) & 1) == 0) {
              if (iVar8 <= iVar2) {
                iVar8 = iVar2;
              }
            }
            else if (iVar2 <= iVar9) {
              iVar9 = iVar2;
            }
            uVar7 = uVar7 + 1;
          } while (iVar8 < iVar9);
        }
      }
    }
    uVar3 = uVar3 + 1;
  } while( true );
}

Assistant:

int Extra_ThreshSelectWeights4(word * t, int nVars, int * pW) {
    int m, Lmin, Lmax, nMints = (1 << nVars);
    assert(nVars == 4);
    for (pW[3] = 1; pW[3] <= nVars; pW[3]++)
        for (pW[2] = pW[3]; pW[2] <= nVars; pW[2]++)
            for (pW[1] = pW[2]; pW[1] <= nVars; pW[1]++)
                for (pW[0] = pW[1]; pW[0] <= nVars; pW[0]++) {
                    Lmin = 10000;
                    Lmax = 0;
                    for (m = 0; m < nMints; m++) {
                        if (Abc_TtGetBit(t, m))
                            Lmin = Abc_MinInt(Lmin,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        else
                            Lmax = Abc_MaxInt(Lmax,
                                    Extra_ThreshWeightedSum(pW, nVars, m));
                        if (Lmax >= Lmin)
                            break;
                    }
                    if (m < nMints)
                        continue;
                    assert(Lmax < Lmin);
                    return Lmin;
                }
    return 0;
}